

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O1

void aom_img_write_nv12(aom_image_t *img,FILE *file)

{
  long lVar1;
  aom_img_fmt_t aVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t __size;
  int iVar6;
  uchar *puVar7;
  uchar *__ptr;
  
  puVar7 = img->planes[0];
  iVar5 = img->stride[0];
  iVar3 = aom_img_plane_width(img,0);
  aVar2 = img->fmt;
  iVar4 = aom_img_plane_height(img,0);
  if (0 < iVar4) {
    do {
      fwrite(puVar7,1,(long)(iVar3 << ((byte)(aVar2 >> 0xb) & 1)),(FILE *)file);
      puVar7 = puVar7 + iVar5;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  puVar7 = img->planes[1];
  __ptr = img->planes[2];
  aVar2 = img->fmt;
  iVar5 = img->stride[1];
  iVar3 = aom_img_plane_width(img,1);
  iVar4 = aom_img_plane_height(img,1);
  if (0 < iVar4) {
    __size = (ulong)((aVar2 & 0x800) != AOM_IMG_FMT_NONE) + 1;
    lVar1 = (long)iVar5 - ((long)iVar3 << (sbyte)(((ulong)aVar2 & 0x800) >> 0xb));
    iVar5 = 0;
    do {
      iVar6 = iVar3;
      if (0 < iVar3) {
        do {
          fwrite(puVar7,__size,1,(FILE *)file);
          fwrite(__ptr,__size,1,(FILE *)file);
          puVar7 = puVar7 + __size;
          __ptr = __ptr + __size;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      puVar7 = puVar7 + lVar1;
      __ptr = __ptr + lVar1;
      iVar5 = iVar5 + 1;
    } while (iVar5 != iVar4);
  }
  return;
}

Assistant:

void aom_img_write_nv12(const aom_image_t *img, FILE *file) {
  // Y plane
  const unsigned char *buf = img->planes[0];
  int stride = img->stride[0];
  int w = aom_img_plane_width(img, 0) *
          ((img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1);
  int h = aom_img_plane_height(img, 0);
  int x, y;

  for (y = 0; y < h; ++y) {
    fwrite(buf, 1, w, file);
    buf += stride;
  }

  // Interleaved U and V plane
  const unsigned char *ubuf = img->planes[1];
  const unsigned char *vbuf = img->planes[2];
  const size_t size = (img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1;
  stride = img->stride[1];
  w = aom_img_plane_width(img, 1);
  h = aom_img_plane_height(img, 1);

  for (y = 0; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      fwrite(ubuf, size, 1, file);
      fwrite(vbuf, size, 1, file);
      ubuf += size;
      vbuf += size;
    }
    ubuf += (stride - w * size);
    vbuf += (stride - w * size);
  }
}